

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::ImageFeatureType_ImageSizeRange
          (ImageFeatureType_ImageSizeRange *this,ImageFeatureType_ImageSizeRange *from)

{
  void *pvVar1;
  SizeRange *pSVar2;
  SizeRange *pSVar3;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ImageFeatureType_ImageSizeRange_007212c8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pSVar2 = from->widthrange_;
  if (pSVar2 == (SizeRange *)0x0 ||
      from == (ImageFeatureType_ImageSizeRange *)&_ImageFeatureType_ImageSizeRange_default_instance_
     ) {
    pSVar3 = (SizeRange *)0x0;
  }
  else {
    pSVar3 = (SizeRange *)operator_new(0x28);
    SizeRange::SizeRange(pSVar3,pSVar2);
  }
  this->widthrange_ = pSVar3;
  pSVar2 = from->heightrange_;
  if (pSVar2 == (SizeRange *)0x0 ||
      from == (ImageFeatureType_ImageSizeRange *)&_ImageFeatureType_ImageSizeRange_default_instance_
     ) {
    pSVar3 = (SizeRange *)0x0;
  }
  else {
    pSVar3 = (SizeRange *)operator_new(0x28);
    SizeRange::SizeRange(pSVar3,pSVar2);
  }
  this->heightrange_ = pSVar3;
  return;
}

Assistant:

ImageFeatureType_ImageSizeRange::ImageFeatureType_ImageSizeRange(const ImageFeatureType_ImageSizeRange& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_widthrange()) {
    widthrange_ = new ::CoreML::Specification::SizeRange(*from.widthrange_);
  } else {
    widthrange_ = NULL;
  }
  if (from.has_heightrange()) {
    heightrange_ = new ::CoreML::Specification::SizeRange(*from.heightrange_);
  } else {
    heightrange_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ImageFeatureType.ImageSizeRange)
}